

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O0

void __thiscall
loser_tree<unsigned_char*>::loser_tree<std::pair<unsigned_char**,unsigned_long>*>
          (loser_tree<unsigned_char*> *this,pair<unsigned_char_**,_unsigned_long> *begin,
          pair<unsigned_char_**,_unsigned_long> *end)

{
  char extraout_AL;
  uint uVar1;
  void *pvVar2;
  double in_XMM0_Qa;
  uint local_2c;
  uint i;
  void *raw;
  pair<unsigned_char_**,_unsigned_long> *end_local;
  pair<unsigned_char_**,_unsigned_long> *begin_local;
  loser_tree<unsigned_char_*> *this_local;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(int *)(this + 0x10) = (int)((long)end - (long)begin >> 4);
  log2(in_XMM0_Qa);
  *(int *)(this + 0x14) = 1 << (extraout_AL + 1U & 0x1f);
  if (1 < *(uint *)(this + 0x10)) {
    pvVar2 = malloc((ulong)*(uint *)(this + 0x14) * 4 + (ulong)*(uint *)(this + 0x14) * 0x10);
    *(void **)this = pvVar2;
    *(void **)(this + 8) = (void *)((long)pvVar2 + (ulong)*(uint *)(this + 0x14) * 4);
    for (local_2c = 0; local_2c < *(uint *)(this + 0x10); local_2c = local_2c + 1) {
      *(uchar ***)(*(long *)(this + 8) + (ulong)local_2c * 0x10) = begin[local_2c].first;
      *(unsigned_long *)(*(long *)(this + 8) + (ulong)local_2c * 0x10 + 8) = begin[local_2c].second;
    }
    memset((void *)(*(long *)(this + 8) + (ulong)*(uint *)(this + 0x10) * 0x10),0,
           (ulong)(uint)(*(int *)(this + 0x14) - *(int *)(this + 0x10)) << 4);
    uVar1 = loser_tree<unsigned_char_*>::init_min((loser_tree<unsigned_char_*> *)this,1);
    **(uint **)this = uVar1;
    return;
  }
  __assert_fail("_nonempty_streams>1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/losertree.h"
                ,0x53,
                "loser_tree<unsigned char *>::loser_tree(Iterator, Iterator) [T = unsigned char *, Iterator = std::pair<unsigned char **, unsigned long> *]"
               );
}

Assistant:

loser_tree(Iterator begin, Iterator end)
		: _nodes(0), _streams(0), _nonempty_streams(end-begin),
		  _stream_offset(1 << (log2(_nonempty_streams-1)+1))
	{
		assert(_nonempty_streams>1);
		void* raw = malloc(_stream_offset*sizeof(unsigned) +
		                   _stream_offset*sizeof(Stream));
		_nodes = static_cast<unsigned*>(raw);
		_streams = reinterpret_cast<Stream*>(
				static_cast<char*>(raw) +
					_stream_offset*sizeof(unsigned));
		for (unsigned i=0; i < _nonempty_streams; ++i) {
			_streams[i].stream = begin[i].first;
			_streams[i].n      = begin[i].second;
		}
		(void) memset(_streams+_nonempty_streams, 0,
			(_stream_offset-_nonempty_streams)*sizeof(Stream));
		_nodes[0] = init_min(1);
		//debug()<<*this;
	}